

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::changeRhsReal(SoPlexBase<double> *this,int i,double *rhs)

{
  int iVar1;
  RangeType RVar2;
  RangeType *pRVar3;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_RDX;
  uint in_ESI;
  SoPlexBase<double> *in_RDI;
  longdouble lVar4;
  undefined4 uVar5;
  undefined2 in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff22;
  SoPlexBase<double> *in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  SPxLPRational *pSVar6;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar7;
  undefined1 local_88 [64];
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *local_48;
  uint local_3c;
  longdouble in_stack_ffffffffffffffd0;
  
  local_48 = in_RDX;
  local_3c = in_ESI;
  _changeRhsReal((SoPlexBase<double> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                 ,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),in_stack_ffffffffffffff40);
  iVar1 = intParam(in_RDI,SYNCMODE);
  if (iVar1 == 1) {
    pSVar6 = in_RDI->_rationalLP;
    uVar7 = local_3c;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x1d870e);
    lVar4 = (longdouble)
            *(double *)
             &(local_48->m_value).num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data;
    uVar5 = SUB104(lVar4,0);
    iVar1 = (int)((unkuint10)lVar4 >> 0x20);
    in_stack_ffffffffffffff20 = (undefined2)((unkuint10)lVar4 >> 0x40);
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=(local_48,in_stack_ffffffffffffffd0);
    (*(pSVar6->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0x36])(pSVar6,(ulong)uVar7,local_88,0);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x1d8791);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20),iVar1);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20),iVar1);
    RVar2 = _rangeTypeRational(in_stack_ffffffffffffff28,
                               (Rational *)
                               CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20),
                               (Rational *)CONCAT44(iVar1,uVar5));
    pRVar3 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_rowTypes,local_3c);
    *pRVar3 = RVar2;
  }
  _invalidateSolution((SoPlexBase<double> *)
                      CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20));
  return;
}

Assistant:

void SoPlexBase<R>::changeRhsReal(int i, const R& rhs)
{
   assert(_realLP != nullptr);

   _changeRhsReal(i, rhs);

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
   {
      _rationalLP->changeRhs(i, rhs);
      _rowTypes[i] = _rangeTypeRational(_rationalLP->lhs(i), _rationalLP->rhs(i));
   }

   _invalidateSolution();
}